

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dh_test.cc
# Opt level: O2

void __thiscall DHTest_Basic_Test::TestBody(DHTest_Basic_Test *this)

{
  uchar *key;
  pointer key_00;
  int iVar1;
  BIGNUM *pBVar2;
  char *pcVar3;
  char *in_R9;
  AssertionResult gtest_ar_1;
  Bytes local_80;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key2;
  UniquePtr<DH> a;
  int check_result;
  int ret;
  Bytes local_28;
  UniquePtr<DH> b;
  
  a._M_t.super___uniq_ptr_impl<dh_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_dh_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_dh_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<dh_st,_bssl::internal::Deleter,_true,_true>)DH_new();
  key2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  key2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       (tuple<dh_st_*,_bssl::internal::Deleter>)
       a._M_t.super___uniq_ptr_impl<dh_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_dh_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_dh_st_*,_false>._M_head_impl != (_Head_base<0UL,_dh_st_*,_false>)0x0;
  if ((tuple<dh_st_*,_bssl::internal::Deleter>)
      a._M_t.super___uniq_ptr_impl<dh_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_dh_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_dh_st_*,_false>
      ._M_head_impl == (_Head_base<0UL,_dh_st_*,_false>)0x0) {
    testing::Message::Message((Message *)&gtest_ar_1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&key1,(internal *)&key2,(AssertionResult *)(anon_var_dwarf_146c22 + 0xc),
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_test.cc"
               ,0x25,(char *)key1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&gtest_ar_1);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&key2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                      .super__Vector_impl_data._M_finish);
    iVar1 = DH_generate_parameters_ex
                      ((DH *)a._M_t.super___uniq_ptr_impl<dh_st,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_dh_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_dh_st_*,_false>._M_head_impl,0x40,5,
                       (BN_GENCB *)0x0);
    key2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    key2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = iVar1 != 0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&gtest_ar_1);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&key1,(internal *)&key2,
                 (AssertionResult *)"DH_generate_parameters_ex(a.get(), 64, 5, nullptr)","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_80,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_test.cc"
                 ,0x26,(char *)key1.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&gtest_ar_1);
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&key2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish);
      iVar1 = DH_check((DH *)a._M_t.super___uniq_ptr_impl<dh_st,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_dh_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_dh_st_*,_false>._M_head_impl,&check_result);
      key2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      key2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ = iVar1 != 0;
      if ((bool)(byte)key2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                      .super__Vector_impl_data._M_start) {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&key2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_finish);
        key2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._0_1_ = (byte)check_result & 1 ^ 1;
        key2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        if (((byte)check_result & 1) != 0) {
          testing::Message::Message((Message *)&gtest_ar_1);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&key1,(internal *)&key2,(AssertionResult *)"check_result & 0x01",
                     "true","false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_80,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_test.cc"
                     ,0x2a,(char *)key1.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_80,(Message *)&gtest_ar_1);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
          std::__cxx11::string::~string((string *)&key1);
          if ((long *)CONCAT44(gtest_ar_1._4_4_,gtest_ar_1._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(gtest_ar_1._4_4_,gtest_ar_1._0_4_) + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&key2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_finish);
        key2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        key2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._0_1_ = ((byte)check_result & 2) == 0;
        if (!(bool)(byte)key2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start) {
          testing::Message::Message((Message *)&gtest_ar_1);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&key1,(internal *)&key2,(AssertionResult *)"check_result & 0x02",
                     "true","false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_80,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_test.cc"
                     ,0x2b,(char *)key1.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_80,(Message *)&gtest_ar_1);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
          std::__cxx11::string::~string((string *)&key1);
          if ((long *)CONCAT44(gtest_ar_1._4_4_,gtest_ar_1._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(gtest_ar_1._4_4_,gtest_ar_1._0_4_) + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&key2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_finish);
        key2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        key2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._0_1_ = ((byte)check_result & 4) == 0;
        if (!(bool)(byte)key2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start) {
          testing::Message::Message((Message *)&gtest_ar_1);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&key1,(internal *)&key2,(AssertionResult *)"check_result & 0x04",
                     "true","false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_80,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_test.cc"
                     ,0x2c,(char *)key1.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_80,(Message *)&gtest_ar_1);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
          std::__cxx11::string::~string((string *)&key1);
          if ((long *)CONCAT44(gtest_ar_1._4_4_,gtest_ar_1._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(gtest_ar_1._4_4_,gtest_ar_1._0_4_) + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&key2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_finish);
        key2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        key2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._0_1_ = ((byte)check_result & 8) == 0;
        if (!(bool)(byte)key2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start) {
          testing::Message::Message((Message *)&gtest_ar_1);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&key1,(internal *)&key2,(AssertionResult *)"check_result & 0x08",
                     "true","false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_80,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_test.cc"
                     ,0x2d,(char *)key1.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_80,(Message *)&gtest_ar_1);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
          std::__cxx11::string::~string((string *)&key1);
          if ((long *)CONCAT44(gtest_ar_1._4_4_,gtest_ar_1._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(gtest_ar_1._4_4_,gtest_ar_1._0_4_) + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&key2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_finish);
        b._M_t.super___uniq_ptr_impl<dh_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_dh_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_dh_st_*,_false>._M_head_impl =
             (__uniq_ptr_data<dh_st,_bssl::internal::Deleter,_true,_true>)
             DHparams_dup((DH *)a._M_t.super___uniq_ptr_impl<dh_st,_bssl::internal::Deleter>._M_t.
                                super__Tuple_impl<0UL,_dh_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_dh_st_*,_false>._M_head_impl);
        key2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        key2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start._0_1_ =
             (tuple<dh_st_*,_bssl::internal::Deleter>)
             b._M_t.super___uniq_ptr_impl<dh_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_dh_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_dh_st_*,_false>._M_head_impl !=
             (_Head_base<0UL,_dh_st_*,_false>)0x0;
        if ((tuple<dh_st_*,_bssl::internal::Deleter>)
            b._M_t.super___uniq_ptr_impl<dh_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_dh_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_dh_st_*,_false>._M_head_impl ==
            (_Head_base<0UL,_dh_st_*,_false>)0x0) {
          testing::Message::Message((Message *)&gtest_ar_1);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&key1,(internal *)&key2,(AssertionResult *)0x4c5f23,"false","true",
                     in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_80,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_test.cc"
                     ,0x30,(char *)key1.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_80,(Message *)&gtest_ar_1);
LAB_0022fc98:
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
          std::__cxx11::string::~string((string *)&key1);
          if ((long *)CONCAT44(gtest_ar_1._4_4_,gtest_ar_1._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(gtest_ar_1._4_4_,gtest_ar_1._0_4_) + 8))();
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&key2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish);
        }
        else {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&key2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish);
          iVar1 = DH_generate_key((DH *)a._M_t.super___uniq_ptr_impl<dh_st,_bssl::internal::Deleter>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_dh_st_*,_bssl::internal::Deleter>.
                                        super__Head_base<0UL,_dh_st_*,_false>._M_head_impl);
          key2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          key2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start._0_1_ = iVar1 != 0;
          if (iVar1 == 0) {
            testing::Message::Message((Message *)&gtest_ar_1);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&key1,(internal *)&key2,
                       (AssertionResult *)"DH_generate_key(a.get())","false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_80,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_test.cc"
                       ,0x32,(char *)key1.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_80,(Message *)&gtest_ar_1);
            goto LAB_0022fc98;
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&key2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish);
          iVar1 = DH_generate_key((DH *)b._M_t.super___uniq_ptr_impl<dh_st,_bssl::internal::Deleter>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_dh_st_*,_bssl::internal::Deleter>.
                                        super__Head_base<0UL,_dh_st_*,_false>._M_head_impl);
          key2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          key2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start._0_1_ = iVar1 != 0;
          if (iVar1 == 0) {
            testing::Message::Message((Message *)&gtest_ar_1);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&key1,(internal *)&key2,
                       (AssertionResult *)"DH_generate_key(b.get())","false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_80,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_test.cc"
                       ,0x33,(char *)key1.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_80,(Message *)&gtest_ar_1);
            goto LAB_0022fc98;
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&key2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish);
          iVar1 = DH_size((DH *)a._M_t.super___uniq_ptr_impl<dh_st,_bssl::internal::Deleter>._M_t.
                                super__Tuple_impl<0UL,_dh_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_dh_st_*,_false>._M_head_impl);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    (&key1,(long)iVar1,(allocator_type *)&key2);
          key_00 = key1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pBVar2 = (BIGNUM *)
                   DH_get0_pub_key((DH *)b._M_t.
                                         super___uniq_ptr_impl<dh_st,_bssl::internal::Deleter>._M_t.
                                         super__Tuple_impl<0UL,_dh_st_*,_bssl::internal::Deleter>.
                                         super__Head_base<0UL,_dh_st_*,_false>._M_head_impl);
          ret = DH_compute_key(key_00,pBVar2,
                               (DH *)a._M_t.super___uniq_ptr_impl<dh_st,_bssl::internal::Deleter>.
                                     _M_t.super__Tuple_impl<0UL,_dh_st_*,_bssl::internal::Deleter>.
                                     super__Head_base<0UL,_dh_st_*,_false>._M_head_impl);
          gtest_ar_1.success_ = false;
          gtest_ar_1._1_3_ = 0;
          testing::internal::CmpHelperGE<int,int>
                    ((internal *)&key2,"ret","0",&ret,(int *)&gtest_ar_1);
          if ((byte)key2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start == '\0') {
            testing::Message::Message((Message *)&gtest_ar_1);
            if (key2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish == (pointer)0x0) {
              pcVar3 = "";
            }
            else {
              pcVar3 = *(char **)key2.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_80,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_test.cc"
                       ,0x37,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_80,(Message *)&gtest_ar_1);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
            if ((long *)CONCAT44(gtest_ar_1._4_4_,gtest_ar_1._0_4_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT44(gtest_ar_1._4_4_,gtest_ar_1._0_4_) + 8))();
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&key2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                              ._M_impl.super__Vector_impl_data._M_finish);
          }
          else {
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&key2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                              ._M_impl.super__Vector_impl_data._M_finish);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&key1,(long)ret);
            iVar1 = DH_size((DH *)b._M_t.super___uniq_ptr_impl<dh_st,_bssl::internal::Deleter>._M_t.
                                  super__Tuple_impl<0UL,_dh_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_dh_st_*,_false>._M_head_impl);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                      (&key2,(long)iVar1,(allocator_type *)&gtest_ar_1);
            key = (uchar *)CONCAT71(key2.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                    (byte)key2.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
            pBVar2 = (BIGNUM *)
                     DH_get0_pub_key((DH *)a._M_t.
                                           super___uniq_ptr_impl<dh_st,_bssl::internal::Deleter>.
                                           _M_t.
                                           super__Tuple_impl<0UL,_dh_st_*,_bssl::internal::Deleter>.
                                           super__Head_base<0UL,_dh_st_*,_false>._M_head_impl);
            ret = DH_compute_key(key,pBVar2,
                                 (DH *)b._M_t.super___uniq_ptr_impl<dh_st,_bssl::internal::Deleter>.
                                       _M_t.super__Tuple_impl<0UL,_dh_st_*,_bssl::internal::Deleter>
                                       .super__Head_base<0UL,_dh_st_*,_false>._M_head_impl);
            local_80.span_.data_ = (uchar *)((ulong)local_80.span_.data_._4_4_ << 0x20);
            testing::internal::CmpHelperGE<int,int>
                      ((internal *)&gtest_ar_1,"ret","0",&ret,(int *)&local_80);
            if (gtest_ar_1.success_ == false) {
              testing::Message::Message((Message *)&local_80);
              if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )gtest_ar_1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl ==
                  (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )0x0) {
                pcVar3 = "";
              }
              else {
                pcVar3 = *(char **)gtest_ar_1.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_28,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_test.cc"
                         ,0x3c,pcVar3);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_28,(Message *)&local_80);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_28);
              if ((long *)local_80.span_.data_ != (long *)0x0) {
                (**(code **)(*(long *)local_80.span_.data_ + 8))();
              }
            }
            else {
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar_1.message_);
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&key2,(long)ret);
              local_80.span_.size_ =
                   (long)key1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)key1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start;
              local_80.span_.data_ =
                   key1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
              local_28.span_.data_ =
                   (uchar *)CONCAT71(key2.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                     (byte)key2.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start);
              local_28.span_.size_ =
                   (long)key2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)local_28.span_.data_;
              testing::internal::CmpHelperEQ<Bytes,Bytes>
                        ((internal *)&gtest_ar_1,"Bytes(key1)","Bytes(key2)",&local_80,&local_28);
              if (gtest_ar_1.success_ == false) {
                testing::Message::Message((Message *)&local_80);
                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )gtest_ar_1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl ==
                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )0x0) {
                  pcVar3 = "";
                }
                else {
                  pcVar3 = *(char **)gtest_ar_1.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_28,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_test.cc"
                           ,0x3f,pcVar3);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_28,(Message *)&local_80);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_28);
                if ((long *)local_80.span_.data_ != (long *)0x0) {
                  (**(code **)(*(long *)local_80.span_.data_ + 8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar_1.message_);
              local_80.span_.data_ =
                   key1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish +
                   -(long)key1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start;
              local_28.span_.data_ = (uchar *)CONCAT44(local_28.span_.data_._4_4_,4);
              testing::internal::CmpHelperGE<unsigned_long,unsigned_int>
                        ((internal *)&gtest_ar_1,"key1.size()","4u",(unsigned_long *)&local_80,
                         (uint *)&local_28);
              if (gtest_ar_1.success_ == false) {
                testing::Message::Message((Message *)&local_80);
                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )gtest_ar_1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl ==
                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )0x0) {
                  pcVar3 = "";
                }
                else {
                  pcVar3 = *(char **)gtest_ar_1.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_28,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_test.cc"
                           ,0x45,pcVar3);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_28,(Message *)&local_80);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_28);
                if ((long *)local_80.span_.data_ != (long *)0x0) {
                  (**(code **)(*(long *)local_80.span_.data_ + 8))();
                }
              }
            }
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar_1.message_);
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      (&key2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
          }
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&key1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        }
        std::unique_ptr<dh_st,_bssl::internal::Deleter>::~unique_ptr(&b);
        goto LAB_0022fec1;
      }
      testing::Message::Message((Message *)&gtest_ar_1);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&key1,(internal *)&key2,
                 (AssertionResult *)"DH_check(a.get(), &check_result)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_80,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/dh/dh_test.cc"
                 ,0x29,(char *)key1.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&gtest_ar_1);
    }
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
  std::__cxx11::string::~string((string *)&key1);
  if ((long *)CONCAT44(gtest_ar_1._4_4_,gtest_ar_1._0_4_) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(gtest_ar_1._4_4_,gtest_ar_1._0_4_) + 8))();
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&key2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish);
LAB_0022fec1:
  std::unique_ptr<dh_st,_bssl::internal::Deleter>::~unique_ptr(&a);
  return;
}

Assistant:

TEST(DHTest, Basic) {
  bssl::UniquePtr<DH> a(DH_new());
  ASSERT_TRUE(a);
  ASSERT_TRUE(DH_generate_parameters_ex(a.get(), 64, DH_GENERATOR_5, nullptr));

  int check_result;
  ASSERT_TRUE(DH_check(a.get(), &check_result));
  EXPECT_FALSE(check_result & DH_CHECK_P_NOT_PRIME);
  EXPECT_FALSE(check_result & DH_CHECK_P_NOT_SAFE_PRIME);
  EXPECT_FALSE(check_result & DH_CHECK_UNABLE_TO_CHECK_GENERATOR);
  EXPECT_FALSE(check_result & DH_CHECK_NOT_SUITABLE_GENERATOR);

  bssl::UniquePtr<DH> b(DHparams_dup(a.get()));
  ASSERT_TRUE(b);

  ASSERT_TRUE(DH_generate_key(a.get()));
  ASSERT_TRUE(DH_generate_key(b.get()));

  std::vector<uint8_t> key1(DH_size(a.get()));
  int ret = DH_compute_key(key1.data(), DH_get0_pub_key(b.get()), a.get());
  ASSERT_GE(ret, 0);
  key1.resize(ret);

  std::vector<uint8_t> key2(DH_size(b.get()));
  ret = DH_compute_key(key2.data(), DH_get0_pub_key(a.get()), b.get());
  ASSERT_GE(ret, 0);
  key2.resize(ret);

  EXPECT_EQ(Bytes(key1), Bytes(key2));

  // |DH_compute_key|, unlike |DH_compute_key_padded|, removes leading zeros
  // from the output, so the key will not have a fixed length. This test uses a
  // small, 64-bit prime, so check for at least 32 bits of output after removing
  // leading zeros.
  EXPECT_GE(key1.size(), 4u);
}